

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

char * str_replace(char *haystack,char *needle,char *replacement)

{
  _Bool _Var1;
  string_buffer_t *sb_00;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *res;
  int pos;
  size_t needle_len;
  size_t haystack_len;
  string_buffer_t *sb;
  char *replacement_local;
  char *needle_local;
  char *haystack_local;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x280,"char *str_replace(const char *, const char *, const char *)");
  }
  if (needle != (char *)0x0) {
    if (replacement != (char *)0x0) {
      sb_00 = string_buffer_create();
      sVar2 = strlen(haystack);
      sVar3 = strlen(needle);
      res._4_4_ = 0;
      while ((ulong)(long)res._4_4_ < sVar2) {
        if ((sVar3 == 0) || (_Var1 = str_starts_with(haystack + res._4_4_,needle), !_Var1)) {
          string_buffer_append(sb_00,haystack[res._4_4_]);
          res._4_4_ = res._4_4_ + 1;
        }
        else {
          string_buffer_append_string(sb_00,replacement);
          res._4_4_ = res._4_4_ + (int)sVar3;
        }
      }
      if ((sVar3 == 0) && (sVar2 == 0)) {
        string_buffer_append_string(sb_00,replacement);
      }
      pcVar4 = string_buffer_to_string(sb_00);
      string_buffer_destroy(sb_00);
      return pcVar4;
    }
    __assert_fail("replacement != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x282,"char *str_replace(const char *, const char *, const char *)");
  }
  __assert_fail("needle != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x281,"char *str_replace(const char *, const char *, const char *)");
}

Assistant:

char *str_replace(const char *haystack, const char *needle, const char *replacement)
{
    assert(haystack != NULL);
    assert(needle != NULL);
    assert(replacement != NULL);

    string_buffer_t *sb = string_buffer_create();
    size_t haystack_len = strlen(haystack);
    size_t needle_len = strlen(needle);

    int pos = 0;
    while (pos < haystack_len) {
        if (needle_len > 0 && str_starts_with(&haystack[pos], needle)) {
            string_buffer_append_string(sb, replacement);
            pos += needle_len;
        } else {
            string_buffer_append(sb, haystack[pos]);
            pos++;
        }
    }
    if (needle_len == 0 && haystack_len == 0)
        string_buffer_append_string(sb, replacement);

    char *res = string_buffer_to_string(sb);
    string_buffer_destroy(sb);
    return res;
}